

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwSetBits(word *a,size_t pos,size_t width,word val)

{
  ulong uVar1;
  sbyte sVar2;
  size_t n;
  word mask;
  word val_local;
  size_t width_local;
  size_t pos_local;
  word *a_local;
  
  mask = 0xffffffffffffffff;
  uVar1 = pos >> 6;
  if (width < 0x40) {
    mask = (ulong)(-1L << (0x40U - (char)width & 0x3f)) >> (0x40U - (char)width & 0x3f);
  }
  sVar2 = (sbyte)(pos & 0x3f);
  a[uVar1] = (mask << sVar2 ^ 0xffffffffffffffff) & a[uVar1];
  a[uVar1] = (val & mask) << sVar2 ^ a[uVar1];
  if (0x40 < (pos & 0x3f) + width) {
    a[uVar1 + 1] = mask << sVar2 & a[uVar1 + 1];
    a[uVar1 + 1] = (val & mask) >> (0x40U - sVar2 & 0x3f) ^ a[uVar1 + 1];
  }
  return;
}

Assistant:

void wwSetBits(word a[], size_t pos, size_t width, register word val)
{
	word mask = WORD_MAX;
	size_t n = pos / B_PER_W;
	ASSERT(wwIsValid(a, W_OF_B(pos + width)));
	ASSERT(width <= B_PER_W);
	// маска
	if (width < B_PER_W)
	{
		mask <<= B_PER_W - width;
		mask >>= B_PER_W - width;
	}
	// биты a[n]
	pos %= B_PER_W;
	a[n] &= ~(mask << pos);
	a[n] ^= (val & mask) << pos;
	// биты a[n + 1]
	if (pos + width > B_PER_W)
	{
		a[n + 1] &= mask << pos;
		a[n + 1] ^= (val & mask) >> (B_PER_W - pos);
	}
}